

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayoutTests.cpp
# Opt level: O0

offset_in_this_suite_class_to_subr
agge::tests::LayoutTests::__NextWordIsDisplayedWithoutSpacesOnWordBreakWhenNextWordIsNotFound_meta
          (char **name)

{
  char **name_local;
  
  *name = "NextWordIsDisplayedWithoutSpacesOnWordBreakWhenNextWordIsNotFound";
  return (offset_in_this_suite_class_to_subr)
         NextWordIsDisplayedWithoutSpacesOnWordBreakWhenNextWordIsNotFound;
}

Assistant:

test( NextWordIsDisplayedWithoutSpacesOnWordBreakWhenNextWordIsNotFound )
			{
				// INIT
				mocks::font_accessor::char_to_index indices[] = { { L'A', 1 }, { L' ', 0 }, };
				mocks::font_accessor::glyph glyphs[] = {
					{ { 4, 0 } },
					{ { 5, 0 } },
				};
				factory_ptr f = create_single_font_factory(c_fm1, indices, glyphs);
				layout l;

				// ACT
				l.process(R("AAAAA   A   A"), limit::wrap(26.0f), *f);

				// ASSERT
				assert_equal(plural
					+ ref_text_line(0.0f, 10.0f, 0.0f, plural + ref_glyph_run(**f, 0.0f, 0.0f, plural + 1 + 1 + 1 + 1 + 1))
					+ ref_text_line(0.0f, 24.0f, 0.0f, plural + ref_glyph_run(**f, 0.0f, 0.0f, plural + 1 + 0 + 0 + 0 + 1)),
					mkvector(l.begin(), l.end()));
			}